

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

logical pnga_locate_nnodes(Integer g_a,Integer *lo,Integer *hi,Integer *np)

{
  short sVar1;
  C_Integer *pCVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  int _ndim;
  long lVar14;
  int _index [7];
  int proc_subscript [7];
  int procB [7];
  int procT [7];
  uint local_198 [8];
  uint local_178 [16];
  uint local_138 [66];
  
  lVar11 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar11)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","nga_locate_nnodes");
    pnga_error((char *)local_138,g_a);
  }
  if (GA[lVar11].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","nga_locate_nnodes");
    pnga_error((char *)local_138,g_a);
  }
  sVar1 = GA[lVar11].ndim;
  lVar14 = (long)sVar1;
  if (0 < lVar14) {
    lVar6 = 0;
    do {
      if (lo[lVar6] < 1) {
        return 0;
      }
      if (hi[lVar6] < lo[lVar6]) {
        return 0;
      }
      if (GA[lVar11].dims[lVar6] < hi[lVar6]) {
        return 0;
      }
      lVar6 = lVar6 + 1;
    } while (lVar14 != lVar6);
  }
  if (GA[lVar11].distr_type == 0) {
    if (0 < sVar1) {
      pCVar2 = GA[lVar11].mapc;
      lVar6 = 0;
      lVar10 = 0;
      do {
        lVar3 = lo[lVar6];
        uVar9 = (uint)((double)lVar3 * GA[lVar11].scale[lVar6]);
        uVar12 = GA[lVar11].nblock[lVar6] - 1;
        if (GA[lVar11].nblock[lVar6] != uVar9) {
          uVar12 = uVar9;
        }
        uVar7 = (ulong)(int)uVar12;
        if (lVar3 < pCVar2[lVar10 + uVar7]) {
          if ((int)uVar12 < 1) {
            uVar12 = uVar12 - 1;
LAB_001662a2:
            uVar9 = uVar12;
            bVar4 = false;
          }
          else {
            do {
              uVar9 = uVar12 - 1;
              bVar4 = pCVar2[lVar10 + (ulong)uVar9] <= lVar3;
              if (pCVar2[lVar10 + (ulong)uVar9] <= lVar3) goto LAB_001662a9;
              uVar9 = uVar12 - 1;
              bVar5 = 0 < (int)uVar12;
              uVar12 = uVar9;
            } while (uVar9 != 0 && bVar5);
            uVar9 = 0xffffffff;
          }
        }
        else {
          uVar9 = GA[lVar11].nblock[lVar6] - 1;
          if ((int)uVar9 <= (int)uVar12) goto LAB_001662a2;
          lVar13 = 0;
          do {
            bVar4 = lVar3 < pCVar2[lVar10 + uVar7 + lVar13 + 1];
            if (lVar3 < pCVar2[lVar10 + uVar7 + lVar13 + 1]) {
              uVar9 = uVar12 + (int)lVar13;
              break;
            }
            lVar13 = lVar13 + 1;
          } while (~uVar7 + (long)GA[lVar11].nblock[lVar6] != lVar13);
        }
LAB_001662a9:
        if (!bVar4) {
          uVar9 = GA[lVar11].nblock[lVar6] - 1;
        }
        local_138[lVar6] = uVar9;
        lVar10 = lVar10 + GA[lVar11].nblock[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar14);
    }
    if (0 < sVar1) {
      pCVar2 = GA[lVar11].mapc;
      lVar6 = 0;
      lVar10 = 0;
      do {
        lVar3 = hi[lVar6];
        uVar9 = (uint)((double)lVar3 * GA[lVar11].scale[lVar6]);
        uVar12 = GA[lVar11].nblock[lVar6] - 1;
        if (GA[lVar11].nblock[lVar6] != uVar9) {
          uVar12 = uVar9;
        }
        uVar7 = (ulong)(int)uVar12;
        if (lVar3 < pCVar2[lVar10 + uVar7]) {
          if ((int)uVar12 < 1) {
            uVar12 = uVar12 - 1;
LAB_0016638b:
            uVar9 = uVar12;
            bVar4 = false;
          }
          else {
            do {
              uVar9 = uVar12 - 1;
              bVar4 = pCVar2[lVar10 + (ulong)uVar9] <= lVar3;
              if (pCVar2[lVar10 + (ulong)uVar9] <= lVar3) goto LAB_00166393;
              uVar9 = uVar12 - 1;
              bVar5 = 0 < (int)uVar12;
              uVar12 = uVar9;
            } while (uVar9 != 0 && bVar5);
            uVar9 = 0xffffffff;
          }
        }
        else {
          uVar9 = GA[lVar11].nblock[lVar6] - 1;
          if ((int)uVar9 <= (int)uVar12) goto LAB_0016638b;
          lVar13 = 0;
          do {
            bVar4 = lVar3 < pCVar2[lVar10 + uVar7 + lVar13 + 1];
            if (lVar3 < pCVar2[lVar10 + uVar7 + lVar13 + 1]) {
              uVar9 = uVar12 + (int)lVar13;
              break;
            }
            lVar13 = lVar13 + 1;
          } while (~uVar7 + (long)GA[lVar11].nblock[lVar6] != lVar13);
        }
LAB_00166393:
        if (!bVar4) {
          uVar9 = GA[lVar11].nblock[lVar6] - 1;
        }
        local_178[lVar6] = uVar9;
        lVar10 = lVar10 + GA[lVar11].nblock[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar14);
    }
    *np = 0;
    lVar11 = 1;
    if (0 < sVar1) {
      memcpy(local_198,local_138,lVar14 * 4);
      lVar11 = 1;
      lVar6 = 0;
      do {
        lVar11 = lVar11 * (int)((local_178[lVar6] - local_138[lVar6]) + 1);
        lVar6 = lVar6 + 1;
      } while (lVar14 != lVar6);
    }
    if (0 < lVar11) {
      lVar6 = 0;
      do {
        if (0 < sVar1) {
          lVar10 = 0;
          do {
            lVar10 = lVar10 + 1;
          } while (lVar14 != lVar10);
        }
        if (0 < sVar1) {
          lVar10 = 0;
          do {
            if ((int)local_198[lVar10] < (int)local_178[lVar10]) {
              local_198[lVar10] = local_198[lVar10] + 1;
              break;
            }
            local_198[lVar10] = local_138[lVar10];
            lVar10 = lVar10 + 1;
          } while (lVar14 != lVar10);
        }
        *np = *np + 1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != lVar11);
    }
  }
  else {
    lVar11 = GA[lVar11].block_total;
    lVar6 = 0;
    if (0 < lVar11) {
      lVar10 = 0;
      do {
        pnga_distribution(g_a,lVar10,(Integer *)local_138,(Integer *)local_178);
        uVar7 = 1;
        if (0 < sVar1) {
          do {
            if (((*(long *)(local_138 + uVar7 * 2 + -2) < lo[uVar7 - 1]) ||
                (bVar8 = 1, hi[uVar7 - 1] < *(long *)(local_138 + uVar7 * 2 + -2))) &&
               ((*(long *)(local_178 + uVar7 * 2 + -2) < lo[uVar7 - 1] ||
                (bVar8 = 1, hi[uVar7 - 1] < *(long *)(local_178 + uVar7 * 2 + -2))))) {
              bVar8 = 0;
            }
          } while ((bVar8 != 0) && (bVar4 = (long)uVar7 < lVar14, uVar7 = uVar7 + 1, bVar4));
          uVar7 = (ulong)bVar8;
        }
        lVar6 = lVar6 + uVar7;
        lVar10 = lVar10 + 1;
      } while (lVar10 != lVar11);
    }
    *np = lVar6;
  }
  return 1;
}

Assistant:

logical pnga_locate_nnodes( Integer g_a,
                                 Integer *lo,
                                 Integer *hi,
                                 Integer *np)
/*    g_a      [input]  global array handle
      lo       [input]  lower indices of patch in global array
      hi       [input]  upper indices of patch in global array
      np       [output] total number of processors containing a portion
                        of the patch

      For a block cyclic data distribution, this function returns a list of
      blocks that cover the region along with the lower and upper indices of
      each block.
*/
{
  int  procT[MAXDIM], procB[MAXDIM], proc_subscript[MAXDIM];
  Integer  proc, i, ga_handle;
  Integer  d, dpos, ndim, elems, use_blocks;
  /* Integer  p_handle; */

  ga_check_handleM(g_a, "nga_locate_nnodes");

  ga_handle = GA_OFFSET + g_a;

  for(d = 0; d< GA[ga_handle].ndim; d++)
    if((lo[d]<1 || hi[d]>GA[ga_handle].dims[d]) ||(lo[d]>hi[d]))return FALSE;

  ndim = GA[ga_handle].ndim;

  if (GA[ga_handle].distr_type == REGULAR) {
    /* find "processor coordinates" for the top left corner and store them
     * in ProcT */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], lo[d], &procT[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    /* find "processor coordinates" for the right bottom corner and store
     * them in procB */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], hi[d], &procB[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    *np = 0;

    /* Find total number of processors containing data and return the
     * result in elems. Also find the lowest "processor coordinates" of the
     * processor block containing data and return these in proc_subscript.
     */
    ga_InitLoopM(&elems, ndim, proc_subscript, procT,procB,GA[ga_handle].nblock);

    /* p_handle = (Integer)GA[ga_handle].p_handle; */
    for(i= 0; i< elems; i++){ 
      Integer _lo[MAXDIM], _hi[MAXDIM];

      /* convert i to owner processor id using the current values in
         proc_subscript */
      ga_ComputeIndexM(&proc, ndim, proc_subscript, GA[ga_handle].nblock); 
      /* get range of global array indices that are owned by owner */
      ga_ownsM(ga_handle, proc, _lo, _hi);

      /* Update to proc_subscript so that it corresponds to the next
       * processor in the block of processors containing the patch */
      ga_UpdateSubscriptM(ndim,proc_subscript,procT,procB,GA[ga_handle].nblock);
      (*np)++;
    }
  } else {
    Integer nblocks = GA[ga_handle].block_total;
    Integer chk, j, tlo[MAXDIM], thi[MAXDIM], cnt;
    cnt = 0;
    for (i=0; i<nblocks; i++) {
      /* check to see if this block overlaps with requested block
       * defined by lo and hi */
      chk = 1;
      /* get limits on block i */
      pnga_distribution(g_a,i,tlo,thi);
      for (j=0; j<ndim && chk==1; j++) {
        /* check to see if at least one end point of the interval
         * represented by blo and bhi falls in the interval
         * represented by lo and hi */
        if (!((tlo[j] >= lo[j] && tlo[j] <= hi[j]) ||
              (thi[j] >= lo[j] && thi[j] <= hi[j]))) {
          chk = 0;
        }
      }
      /* store blocks that overlap request region in proclist */
      if (chk) {
        cnt++;
      }
    }
    *np = cnt;
  }
  return(TRUE);
}